

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_refit.h
# Opt level: O2

BBox3fa * __thiscall
embree::sse2::BVHNRefitT<4,_embree::TriangleMesh,_embree::TriangleMv<4>_>::leafBounds
          (BBox3fa *__return_storage_ptr__,
          BVHNRefitT<4,_embree::TriangleMesh,_embree::TriangleMv<4>_> *this,NodeRef *ref)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  ulong uVar5;
  TriangleMesh *pTVar6;
  long lVar7;
  char *pcVar8;
  size_t sVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  undefined8 *puVar15;
  long lVar16;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  vuint<4> vprimID;
  vuint<4> vgeomID;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  uint local_58 [10];
  
  aVar11 = _DAT_01f45a40;
  aVar10 = _DAT_01f45a30;
  uVar5 = ref->ptr;
  if (uVar5 == 8) {
    *(undefined8 *)&(__return_storage_ptr__->lower).field_0 = 0x7f8000007f800000;
    *(undefined8 *)((long)&(__return_storage_ptr__->lower).field_0 + 8) = 0x7f8000007f800000;
    *(undefined8 *)&(__return_storage_ptr__->upper).field_0 = 0xff800000ff800000;
    *(undefined8 *)((long)&(__return_storage_ptr__->upper).field_0 + 8) = 0xff800000ff800000;
  }
  else {
    lVar13 = (uVar5 & 0xfffffffffffffff0) + 0xa0;
    aVar17 = _DAT_01f45a40;
    aVar18 = _DAT_01f45a30;
    for (lVar14 = 0; lVar14 != (ulong)((uint)uVar5 & 0xf) - 8; lVar14 = lVar14 + 1) {
      puVar15 = (undefined8 *)(lVar14 * 0xb0 + (uVar5 & 0xfffffffffffffff0));
      pTVar6 = this->mesh;
      local_58[4] = 0xffffffff;
      local_58[5] = 0xffffffff;
      local_58[6] = 0xffffffff;
      local_58[7] = 0xffffffff;
      local_58[0] = 0xffffffff;
      local_58[1] = 0xffffffff;
      local_58[2] = 0xffffffff;
      local_58[3] = 0xffffffff;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      local_c8 = 0;
      uStack_c0 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      local_e8 = 0;
      uStack_e0 = 0;
      aVar19 = aVar11;
      aVar20 = aVar10;
      for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 4) {
        uVar4 = *(uint *)(lVar13 + lVar12);
        if ((ulong)uVar4 == 0xffffffff) break;
        lVar16 = (ulong)uVar4 * *(long *)&pTVar6->field_0x68;
        lVar7 = *(long *)&(pTVar6->super_Geometry).field_0x58;
        pcVar8 = (pTVar6->vertices0).super_RawBufferView.ptr_ofs;
        sVar9 = (pTVar6->vertices0).super_RawBufferView.stride;
        auVar1 = *(undefined1 (*) [16])(pcVar8 + *(uint *)(lVar7 + lVar16) * sVar9);
        auVar2 = *(undefined1 (*) [16])(pcVar8 + *(uint *)(lVar7 + 4 + lVar16) * sVar9);
        auVar3 = *(undefined1 (*) [16])(pcVar8 + *(uint *)(lVar7 + 8 + lVar16) * sVar9);
        auVar21 = minps(auVar2,auVar3);
        auVar22 = maxps(auVar2,auVar3);
        auVar23 = minps(auVar1,auVar21);
        auVar21 = maxps(auVar1,auVar22);
        aVar20.m128 = (__m128)minps(aVar20.m128,auVar23);
        aVar19.m128 = (__m128)maxps(aVar19.m128,auVar21);
        *(undefined4 *)((long)local_58 + lVar12 + 0x10) = *(undefined4 *)(lVar13 + -0x10 + lVar12);
        *(uint *)((long)local_58 + lVar12) = uVar4;
        *(int *)((long)&local_88 + lVar12) = auVar1._0_4_;
        *(int *)((long)&local_78 + lVar12) = auVar1._4_4_;
        *(int *)((long)&local_68 + lVar12) = auVar1._8_4_;
        *(int *)((long)&local_b8 + lVar12) = auVar2._0_4_;
        *(int *)((long)&local_a8 + lVar12) = auVar2._4_4_;
        *(int *)((long)&local_98 + lVar12) = auVar2._8_4_;
        *(int *)((long)&local_e8 + lVar12) = auVar3._0_4_;
        *(int *)((long)&local_d8 + lVar12) = auVar3._4_4_;
        *(int *)((long)&local_c8 + lVar12) = auVar3._8_4_;
      }
      *puVar15 = local_88;
      puVar15[1] = uStack_80;
      puVar15[2] = local_78;
      puVar15[3] = uStack_70;
      puVar15[4] = local_68;
      puVar15[5] = uStack_60;
      puVar15[6] = local_b8;
      puVar15[7] = uStack_b0;
      puVar15[8] = local_a8;
      puVar15[9] = uStack_a0;
      puVar15[10] = local_98;
      puVar15[0xb] = uStack_90;
      puVar15[0xc] = local_e8;
      puVar15[0xd] = uStack_e0;
      puVar15[0xe] = local_d8;
      puVar15[0xf] = uStack_d0;
      puVar15[0x10] = local_c8;
      puVar15[0x11] = uStack_c0;
      puVar15[0x12] = CONCAT44(local_58[5],local_58[4]);
      puVar15[0x13] = CONCAT44(local_58[7],local_58[6]);
      puVar15[0x14] = CONCAT44(local_58[1],local_58[0]);
      puVar15[0x15] = CONCAT44(local_58[3],local_58[2]);
      aVar18.m128 = (__m128)minps(aVar18.m128,aVar20.m128);
      aVar17.m128 = (__m128)maxps(aVar17.m128,aVar19.m128);
      lVar13 = lVar13 + 0xb0;
    }
    (__return_storage_ptr__->lower).field_0 = aVar18;
    (__return_storage_ptr__->upper).field_0 = aVar17;
  }
  return __return_storage_ptr__;
}

Assistant:

virtual const BBox3fa leafBounds (NodeRef& ref) const
      {
        size_t num; char* prim = ref.leaf(num);
        if (unlikely(ref == BVH::emptyNode)) return empty;

        BBox3fa bounds = empty;
        for (size_t i=0; i<num; i++)
            bounds.extend(((Primitive*)prim)[i].update(mesh));
        return bounds;
      }